

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Iterator.h
# Opt level: O3

void __thiscall arangodb::velocypack::ObjectIterator::next(ObjectIterator *this)

{
  ulong uVar1;
  byte *start;
  byte *local_18;
  
  if (this->_position != this->_size) {
    this->_position = this->_position + 1;
    local_18 = this->_current;
    if (local_18 != (byte *)0x0) {
      uVar1 = (ulong)"\x01\x01"[*local_18];
      if (uVar1 == 0) {
        uVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSizeDynamic
                          ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                           &local_18,local_18);
        local_18 = this->_current;
      }
      start = local_18 + uVar1;
      this->_current = start;
      uVar1 = (ulong)"\x01\x01"[local_18[uVar1]];
      if (uVar1 == 0) {
        local_18 = start;
        uVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSizeDynamic
                          ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                           &local_18,start);
        start = this->_current;
      }
      this->_current = start + uVar1;
    }
  }
  return;
}

Assistant:

[[nodiscard]] Slice key(bool translate = true) const {
    if (VELOCYPACK_UNLIKELY(!valid())) {
      throw Exception{Exception::IndexOutOfBounds};
    }
    if (_current != nullptr) {
      Slice s{_current};
      return translate ? s.makeKey() : s;
    }
    return _slice.getNthKey(_position, translate);
  }